

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_>::Resize
          (TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_> *this,
          hash_t nhsize)

{
  Node *block;
  Node *pNVar1;
  ulong uVar2;
  FString *this_00;
  bool bVar3;
  
  uVar2 = (ulong)this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  this_00 = &(block->Pair).Value.filename;
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    if (*(long *)(this_00 + -6) != 1) {
      pNVar1 = NewKey(this,*(int *)(this_00 + -5));
      MapinfoEdMapItem::MapinfoEdMapItem(&(pNVar1->Pair).Value,(MapinfoEdMapItem *)(this_00 + -4));
      FString::~FString(this_00);
    }
    this_00 = this_00 + 8;
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}